

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O0

int PKCS12_handle_safe_bag(CBS *safe_bag,pkcs12_context *ctx)

{
  X509 *pXVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  uint8_t *puVar5;
  bool bVar6;
  EVP_PKEY *local_d0;
  size_t sStack_c0;
  int ok;
  size_t friendly_name_len;
  uint8_t *friendly_name;
  X509 *x509;
  uint8_t *inp;
  CBS cert;
  CBS wrapped_cert;
  CBS cert_type;
  CBS cert_bag;
  EVP_PKEY *pkey;
  int is_shrouded_key_bag;
  int is_key_bag;
  CBS bag_attrs;
  CBS wrapped_value;
  CBS bag_id;
  pkcs12_context *ctx_local;
  CBS *safe_bag_local;
  
  iVar2 = CBS_get_asn1(safe_bag,(CBS *)&wrapped_value.len,6);
  if ((iVar2 == 0) || (iVar2 = CBS_get_asn1(safe_bag,(CBS *)&bag_attrs.len,0xa0000000), iVar2 == 0))
  {
    ERR_put_error(0x13,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                  ,0x148);
    safe_bag_local._4_4_ = 0;
  }
  else {
    sVar4 = CBS_len(safe_bag);
    if (sVar4 == 0) {
      CBS_init((CBS *)&is_shrouded_key_bag,(uint8_t *)0x0,0);
    }
    else {
      iVar2 = CBS_get_asn1(safe_bag,(CBS *)&is_shrouded_key_bag,0x20000011);
      if ((iVar2 == 0) || (sVar4 = CBS_len(safe_bag), sVar4 != 0)) {
        ERR_put_error(0x13,0,100,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                      ,0x14f);
        return 0;
      }
    }
    iVar2 = CBS_mem_equal((CBS *)&wrapped_value.len,kKeyBag,0xb);
    iVar3 = CBS_mem_equal((CBS *)&wrapped_value.len,kPKCS8ShroudedKeyBag,0xb);
    if ((iVar2 == 0) && (iVar3 == 0)) {
      iVar2 = CBS_mem_equal((CBS *)&wrapped_value.len,kCertBag,0xb);
      if (iVar2 == 0) {
        safe_bag_local._4_4_ = 1;
      }
      else {
        iVar2 = CBS_get_asn1((CBS *)&bag_attrs.len,(CBS *)&cert_type.len,0x20000010);
        if ((((iVar2 == 0) ||
             (iVar2 = CBS_get_asn1((CBS *)&cert_type.len,(CBS *)&wrapped_cert.len,6), iVar2 == 0))
            || (iVar2 = CBS_get_asn1((CBS *)&cert_type.len,(CBS *)&cert.len,0xa0000000), iVar2 == 0)
            ) || (iVar2 = CBS_get_asn1((CBS *)&cert.len,(CBS *)&inp,4), iVar2 == 0)) {
          ERR_put_error(0x13,0,100,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                        ,0x177);
          safe_bag_local._4_4_ = 0;
        }
        else {
          iVar2 = CBS_mem_equal((CBS *)&wrapped_cert.len,kX509Certificate,10);
          if (iVar2 == 0) {
            safe_bag_local._4_4_ = 1;
          }
          else {
            sVar4 = CBS_len((CBS *)&inp);
            if (sVar4 < 0x8000000000000000) {
              x509 = (X509 *)CBS_data((CBS *)&inp);
              sVar4 = CBS_len((CBS *)&inp);
              friendly_name = (uint8_t *)d2i_X509((X509 **)0x0,(uchar **)&x509,sVar4);
              pXVar1 = x509;
              if ((X509 *)friendly_name == (X509 *)0x0) {
                ERR_put_error(0x13,0,100,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                              ,0x189);
                safe_bag_local._4_4_ = 0;
              }
              else {
                puVar5 = CBS_data((CBS *)&inp);
                sVar4 = CBS_len((CBS *)&inp);
                if (pXVar1 == (X509 *)(puVar5 + sVar4)) {
                  iVar2 = parse_bag_attributes
                                    ((CBS *)&is_shrouded_key_bag,(uint8_t **)&friendly_name_len,
                                     &stack0xffffffffffffff40);
                  if (iVar2 == 0) {
                    X509_free((X509 *)friendly_name);
                    safe_bag_local._4_4_ = 0;
                  }
                  else {
                    bVar6 = true;
                    if (sStack_c0 != 0) {
                      iVar2 = X509_alias_set1((X509 *)friendly_name,(uchar *)friendly_name_len,
                                              (int)sStack_c0);
                      bVar6 = iVar2 != 0;
                    }
                    OPENSSL_free((void *)friendly_name_len);
                    if ((bVar6) &&
                       (sVar4 = sk_X509_push(ctx->out_certs,(X509 *)friendly_name), sVar4 != 0)) {
                      safe_bag_local._4_4_ = 1;
                    }
                    else {
                      X509_free((X509 *)friendly_name);
                      safe_bag_local._4_4_ = 0;
                    }
                  }
                }
                else {
                  ERR_put_error(0x13,0,100,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                                ,0x18e);
                  X509_free((X509 *)friendly_name);
                  safe_bag_local._4_4_ = 0;
                }
              }
            }
            else {
              ERR_put_error(0x13,0,100,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                            ,0x182);
              safe_bag_local._4_4_ = 0;
            }
          }
        }
      }
    }
    else if (*ctx->out_key == (EVP_PKEY *)0x0) {
      if (iVar2 == 0) {
        local_d0 = (EVP_PKEY *)
                   PKCS8_parse_encrypted_private_key
                             ((CBS *)&bag_attrs.len,ctx->password,ctx->password_len);
      }
      else {
        local_d0 = (EVP_PKEY *)EVP_parse_private_key((CBS *)&bag_attrs.len);
      }
      if (local_d0 == (EVP_PKEY *)0x0) {
        safe_bag_local._4_4_ = 0;
      }
      else {
        sVar4 = CBS_len((CBS *)&bag_attrs.len);
        if (sVar4 == 0) {
          *ctx->out_key = (EVP_PKEY *)local_d0;
          safe_bag_local._4_4_ = 1;
        }
        else {
          ERR_put_error(0x13,0,100,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                        ,0x166);
          EVP_PKEY_free(local_d0);
          safe_bag_local._4_4_ = 0;
        }
      }
    }
    else {
      ERR_put_error(0x13,0,0x71,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                    ,0x159);
      safe_bag_local._4_4_ = 0;
    }
  }
  return safe_bag_local._4_4_;
}

Assistant:

static int PKCS12_handle_safe_bag(CBS *safe_bag, struct pkcs12_context *ctx) {
  CBS bag_id, wrapped_value, bag_attrs;
  if (!CBS_get_asn1(safe_bag, &bag_id, CBS_ASN1_OBJECT) ||
      !CBS_get_asn1(safe_bag, &wrapped_value,
                    CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
    return 0;
  }
  if (CBS_len(safe_bag) == 0) {
    CBS_init(&bag_attrs, NULL, 0);
  } else if (!CBS_get_asn1(safe_bag, &bag_attrs, CBS_ASN1_SET) ||
             CBS_len(safe_bag) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
    return 0;
  }

  const int is_key_bag = CBS_mem_equal(&bag_id, kKeyBag, sizeof(kKeyBag));
  const int is_shrouded_key_bag = CBS_mem_equal(&bag_id, kPKCS8ShroudedKeyBag,
                                                sizeof(kPKCS8ShroudedKeyBag));
  if (is_key_bag || is_shrouded_key_bag) {
    // See RFC 7292, section 4.2.1 and 4.2.2.
    if (*ctx->out_key) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_MULTIPLE_PRIVATE_KEYS_IN_PKCS12);
      return 0;
    }

    EVP_PKEY *pkey =
        is_key_bag ? EVP_parse_private_key(&wrapped_value)
                   : PKCS8_parse_encrypted_private_key(
                         &wrapped_value, ctx->password, ctx->password_len);
    if (pkey == NULL) {
      return 0;
    }

    if (CBS_len(&wrapped_value) != 0) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      EVP_PKEY_free(pkey);
      return 0;
    }

    *ctx->out_key = pkey;
    return 1;
  }

  if (CBS_mem_equal(&bag_id, kCertBag, sizeof(kCertBag))) {
    // See RFC 7292, section 4.2.3.
    CBS cert_bag, cert_type, wrapped_cert, cert;
    if (!CBS_get_asn1(&wrapped_value, &cert_bag, CBS_ASN1_SEQUENCE) ||
        !CBS_get_asn1(&cert_bag, &cert_type, CBS_ASN1_OBJECT) ||
        !CBS_get_asn1(&cert_bag, &wrapped_cert,
                      CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0) ||
        !CBS_get_asn1(&wrapped_cert, &cert, CBS_ASN1_OCTETSTRING)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      return 0;
    }

    // Skip unknown certificate types.
    if (!CBS_mem_equal(&cert_type, kX509Certificate,
                       sizeof(kX509Certificate))) {
      return 1;
    }

    if (CBS_len(&cert) > LONG_MAX) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      return 0;
    }

    const uint8_t *inp = CBS_data(&cert);
    X509 *x509 = d2i_X509(NULL, &inp, (long)CBS_len(&cert));
    if (!x509) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      return 0;
    }

    if (inp != CBS_data(&cert) + CBS_len(&cert)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      X509_free(x509);
      return 0;
    }

    uint8_t *friendly_name;
    size_t friendly_name_len;
    if (!parse_bag_attributes(&bag_attrs, &friendly_name, &friendly_name_len)) {
      X509_free(x509);
      return 0;
    }
    int ok = friendly_name_len == 0 ||
             X509_alias_set1(x509, friendly_name, friendly_name_len);
    OPENSSL_free(friendly_name);
    if (!ok || 0 == sk_X509_push(ctx->out_certs, x509)) {
      X509_free(x509);
      return 0;
    }

    return 1;
  }

  // Unknown element type - ignore it.
  return 1;
}